

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool enchant(object *obj,wchar_t n,wchar_t eflag)

{
  bool bVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint local_28;
  wchar_t wStack_24;
  _Bool res;
  wchar_t prob;
  wchar_t i;
  wchar_t eflag_local;
  wchar_t n_local;
  object *obj_local;
  
  bVar1 = false;
  local_28 = (uint)obj->number * 100;
  _Var2 = tval_is_ammo(obj);
  if (_Var2) {
    local_28 = local_28 / 0x14;
  }
  for (wStack_24 = L'\0'; wStack_24 < n; wStack_24 = wStack_24 + L'\x01') {
    if ((local_28 < 0x65) || (uVar3 = Rand_div(local_28), (int)uVar3 < 100)) {
      if (((eflag & 1U) != 0) && (_Var2 = enchant2(obj,&obj->to_h), _Var2)) {
        bVar1 = true;
      }
      if (((eflag & 2U) != 0) && (_Var2 = enchant2(obj,&obj->to_d), _Var2)) {
        bVar1 = true;
      }
      if (((eflag & 4U) != 0) && (_Var2 = enchant2(obj,&obj->to_a), _Var2)) {
        bVar1 = true;
      }
    }
  }
  if (obj->known == (object *)0x0) {
    __assert_fail("obj->known",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                  ,0x159,"_Bool enchant(struct object *, int, int)");
  }
  obj->known->to_h = obj->to_h;
  obj->known->to_d = obj->to_d;
  obj->known->to_a = obj->to_a;
  if (bVar1) {
    player->upkeep->update = player->upkeep->update | 0x401;
    player->upkeep->notice = player->upkeep->notice | 1;
    player->upkeep->redraw = player->upkeep->redraw | 0x60000;
  }
  return bVar1;
}

Assistant:

static bool enchant(struct object *obj, int n, int eflag)
{
	int i, prob;
	bool res = false;

	/* Large piles resist enchantment */
	prob = obj->number * 100;

	/* Missiles are easy to enchant */
	if (tval_is_ammo(obj)) prob = prob / 20;

	/* Try "n" times */
	for (i = 0; i < n; i++)
	{
		/* Roll for pile resistance */
		if (prob > 100 && randint0(prob) >= 100) continue;

		/* Try the three kinds of enchantment we can do */
		if ((eflag & ENCH_TOHIT) && enchant2(obj, &obj->to_h)) res = true;
		if ((eflag & ENCH_TODAM) && enchant2(obj, &obj->to_d)) res = true;
		if ((eflag & ENCH_TOAC)  && enchant2(obj, &obj->to_a)) res = true;
	}

	/* Update knowledge */
	assert(obj->known);
	obj->known->to_h = obj->to_h;
	obj->known->to_d = obj->to_d;
	obj->known->to_a = obj->to_a;

	/* Failure */
	if (!res) return (false);

	/* Recalculate bonuses, gear */
	player->upkeep->update |= (PU_BONUS | PU_INVEN);

	/* Combine the pack (later) */
	player->upkeep->notice |= (PN_COMBINE);

	/* Redraw stuff */
	player->upkeep->redraw |= (PR_INVEN | PR_EQUIP );

	/* Success */
	return (true);
}